

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O2

bool usage(char *a0)

{
  FILE *__stream;
  QMAKE_MODE QVar1;
  char *pcVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  __stream = _stdout;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)&local_50,a0);
  QVar1 = default_mode((QString *)&local_50);
  pcVar2 = "";
  pcVar3 = "";
  if (QVar1 == QMAKE_GENERATE_PROJECT) {
    pcVar3 = " (default)";
  }
  QString::QString((QString *)&QStack_68,a0);
  QVar1 = default_mode((QString *)&QStack_68);
  if (QVar1 == QMAKE_GENERATE_MAKEFILE) {
    pcVar2 = " (default)";
  }
  fprintf(__stream,
          "Usage: %s [mode] [options] [files]\n\nQMake has two modes, one mode for generating project files based on\nsome heuristics, and the other for generating makefiles. Normally you\nshouldn\'t need to specify a mode, as makefile generation is the default\nmode for qmake, but you may use this to test qmake on an existing project\n\nMode:\n  -project       Put qmake into project file generation mode%s\n                 In this mode qmake interprets [files] as files to\n                 be added to the .pro file. By default, all files with\n                 known source extensions are added.\n                 Note: The created .pro file probably will \n                 need to be edited. For example add the QT variable to \n                 specify what modules are required.\n  -makefile      Put qmake into makefile generation mode%s\n                 In this mode qmake interprets files as project files to\n                 be processed, if skipped qmake will try to find a project\n                 file in your current working directory\n\nWarnings Options:\n  -Wnone         Turn off all warnings; specific ones may be re-enabled by\n                 later -W options\n  -Wall          Turn on all warnings\n  -Wparser       Turn on parser warnings\n  -Wlogic        Turn on logic warnings (on by default)\n  -Wdeprecated   Turn on deprecation warnings (on by default)\n\nOptions:\n   * You can place any variable assignment in options and it will be *\n   * processed as if it was in [files]. These assignments will be    *\n   * processed before [files] by default.                            *\n  -o file        Write output to file\n  -d             Increase debug level\n  -t templ       Overrides TEMPLATE as templ\n  -tp prefix     Overrides TEMPLATE so that prefix is prefixed into the value\n  -help          This help\n  -v             Version information\n  -early         All subsequent variable assignments will be\n                 parsed right before default_pre.prf\n  -before        All subsequent variable assignments will be\n                 parsed right befor..." /* TRUNCATED STRING LITERAL */
          ,a0,pcVar3,pcVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool usage(const char *a0)
{
    fprintf(stdout, "Usage: %s [mode] [options] [files]\n"
            "\n"
            "QMake has two modes, one mode for generating project files based on\n"
            "some heuristics, and the other for generating makefiles. Normally you\n"
            "shouldn't need to specify a mode, as makefile generation is the default\n"
            "mode for qmake, but you may use this to test qmake on an existing project\n"
            "\n"
            "Mode:\n"
            "  -project       Put qmake into project file generation mode%s\n"
            "                 In this mode qmake interprets [files] as files to\n"
            "                 be added to the .pro file. By default, all files with\n"
            "                 known source extensions are added.\n"
            "                 Note: The created .pro file probably will \n"
            "                 need to be edited. For example add the QT variable to \n"
            "                 specify what modules are required.\n"
            "  -makefile      Put qmake into makefile generation mode%s\n"
            "                 In this mode qmake interprets files as project files to\n"
            "                 be processed, if skipped qmake will try to find a project\n"
            "                 file in your current working directory\n"
            "\n"
            "Warnings Options:\n"
            "  -Wnone         Turn off all warnings; specific ones may be re-enabled by\n"
            "                 later -W options\n"
            "  -Wall          Turn on all warnings\n"
            "  -Wparser       Turn on parser warnings\n"
            "  -Wlogic        Turn on logic warnings (on by default)\n"
            "  -Wdeprecated   Turn on deprecation warnings (on by default)\n"
            "\n"
            "Options:\n"
            "   * You can place any variable assignment in options and it will be *\n"
            "   * processed as if it was in [files]. These assignments will be    *\n"
            "   * processed before [files] by default.                            *\n"
            "  -o file        Write output to file\n"
            "  -d             Increase debug level\n"
            "  -t templ       Overrides TEMPLATE as templ\n"
            "  -tp prefix     Overrides TEMPLATE so that prefix is prefixed into the value\n"
            "  -help          This help\n"
            "  -v             Version information\n"
            "  -early         All subsequent variable assignments will be\n"
            "                 parsed right before default_pre.prf\n"
            "  -before        All subsequent variable assignments will be\n"
            "                 parsed right before [files] (the default)\n"
            "  -after         All subsequent variable assignments will be\n"
            "                 parsed after [files]\n"
            "  -late          All subsequent variable assignments will be\n"
            "                 parsed right after default_post.prf\n"
            "  -norecursive   Don't do a recursive search\n"
            "  -recursive     Do a recursive search\n"
            "  -set <prop> <value> Set persistent property\n"
            "  -unset <prop>  Unset persistent property\n"
            "  -query <prop>  Query persistent property. Show all if <prop> is empty.\n"
            "  -qtconf file   Use file instead of looking for qt" QT_STRINGIFY(QT_VERSION_MAJOR) ".conf, then qt.conf\n"
            "  -cache file    Use file as cache           [makefile mode only]\n"
            "  -spec spec     Use spec as QMAKESPEC       [makefile mode only]\n"
            "  -nocache       Don't use a cache file      [makefile mode only]\n"
            "  -nodepend      Don't generate dependencies [makefile mode only]\n"
            "  -nomoc         Don't generate moc targets  [makefile mode only]\n"
            "  -nopwd         Don't look for files in pwd [project mode only]\n"
            ,a0,
            default_mode(a0) == Option::QMAKE_GENERATE_PROJECT  ? " (default)" : "",
            default_mode(a0) == Option::QMAKE_GENERATE_MAKEFILE ? " (default)" : ""
        );
    return false;
}